

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_sse4.h
# Opt level: O0

__m128i blend_4_u8(uint8_t *src0,uint8_t *src1,__m128i *v_m0_b,__m128i *v_m1_b,__m128i *rounding)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  void *in_RSI;
  void *in_RDI;
  undefined1 (*in_R8) [16];
  undefined8 in_XMM0_Qa;
  undefined8 uVar3;
  undefined8 in_XMM0_Qb;
  undefined8 uVar4;
  __m128i alVar5;
  __m128i v_res;
  __m128i v_res_w;
  __m128i v_p0_w;
  __m128i v_s1_b;
  __m128i v_s0_b;
  
  xx_loadl_32(in_RDI);
  uVar3 = in_XMM0_Qa;
  uVar4 = in_XMM0_Qb;
  alVar5 = xx_loadl_32(in_RSI);
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar1._8_8_ = uVar4;
  auVar1._0_8_ = uVar3;
  auVar1 = vpunpcklbw_avx(auVar2,auVar1);
  auVar2 = vpunpcklbw_avx(*in_RDX,*in_RCX);
  auVar1 = vpmaddubsw_avx(auVar1,auVar2);
  auVar1 = vpmulhrsw_avx(auVar1,*in_R8);
  vpackuswb_avx(auVar1,auVar1);
  alVar5[0] = (longlong)in_R8;
  return alVar5;
}

Assistant:

static inline __m128i blend_4_u8(const uint8_t *src0, const uint8_t *src1,
                                 const __m128i *v_m0_b, const __m128i *v_m1_b,
                                 const __m128i *rounding) {
  const __m128i v_s0_b = xx_loadl_32(src0);
  const __m128i v_s1_b = xx_loadl_32(src1);

  const __m128i v_p0_w = _mm_maddubs_epi16(_mm_unpacklo_epi8(v_s0_b, v_s1_b),
                                           _mm_unpacklo_epi8(*v_m0_b, *v_m1_b));

  const __m128i v_res_w = _mm_mulhrs_epi16(v_p0_w, *rounding);
  const __m128i v_res = _mm_packus_epi16(v_res_w, v_res_w);
  return v_res;
}